

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool function_exec(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  ushort uVar1;
  gravity_function_t *f;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  uint32_t index;
  gravity_closure_t *closure;
  gravity_function_t *func;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (args->isa == gravity_class_function) {
    f = (gravity_function_t *)(args->field_1).p;
    aVar2.p = (gravity_object_t *)gravity_closure_new(vm,f);
    for (; (ushort)_buffer._4094_2_ < f->nparams; _buffer._4094_2_ = _buffer._4094_2_ + 1) {
      uVar1 = f->nparams;
      args[(uint)uVar1 - (uint)(ushort)_buffer._4094_2_].isa = gravity_class_null;
      args[(uint)uVar1 - (uint)(ushort)_buffer._4094_2_].field_1.n = 1;
    }
    value.field_1.p = (gravity_object_t *)aVar2.n;
    value.isa = (aVar2.p)->isa;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
  }
  else {
    snprintf(local_1028,0x1000,"Unable to convert Object to closure");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
  }
  return false;
}

Assistant:

static bool function_exec (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (!VALUE_ISA_FUNCTION(GET_VALUE(0))) RETURN_ERROR("Unable to convert Object to closure");
    
    gravity_function_t *func = VALUE_AS_FUNCTION(GET_VALUE(0));
    gravity_closure_t *closure = gravity_closure_new(vm, func);
    
    // fix the default arg values case
    // to be really correct and safe, stack size should be checked here but I know in advance that a minimum DEFAULT_MINSTACK_SIZE
    // is guaratee before calling a function, so just make sure that you do not use more than DEFAULT_MINSTACK_SIZE arguments
    // DEFAULT_MINSTACK_SIZE is 256 and in case of a 256 function arguments a maximum registers error would be returned
    // so I can assume to be always safe here
    while (nargs < func->nparams) {
        uint32_t index = (func->nparams - nargs);
        args[index] = VALUE_FROM_UNDEFINED;
        ++nargs;
    }
    
    RETURN_CLOSURE(VALUE_FROM_OBJECT(closure), rindex);
}